

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.c
# Opt level: O0

void MemoryStream_SetPosition
               (MemoryStream *memory_stream,ptrdiff_t offset,MemoryStream_Origin origin)

{
  MemoryStream_Origin origin_local;
  ptrdiff_t offset_local;
  MemoryStream *memory_stream_local;
  
  if (origin == MEMORYSTREAM_START) {
    memory_stream->position = offset;
  }
  else if (origin == MEMORYSTREAM_CURRENT) {
    memory_stream->position = memory_stream->position + offset;
  }
  else if (origin == MEMORYSTREAM_END) {
    memory_stream->position = memory_stream->end + offset;
  }
  return;
}

Assistant:

void MemoryStream_SetPosition(MemoryStream *memory_stream, ptrdiff_t offset, enum MemoryStream_Origin origin)
{
	switch (origin)
	{
		case MEMORYSTREAM_START:
			memory_stream->position = (size_t)offset;
			break;
		case MEMORYSTREAM_CURRENT:
			memory_stream->position = (size_t)(memory_stream->position + offset);
			break;
		case MEMORYSTREAM_END:
			memory_stream->position = (size_t)(memory_stream->end + offset);
			break;
	}
}